

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

bool embree::avx2::DiscMiIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  byte bVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  int iVar18;
  ulong uVar19;
  Scene *pSVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_198;
  undefined8 uStack_190;
  RayQueryContext *local_180;
  Primitive *local_178;
  Scene *local_170;
  RTCFilterFunctionNArguments local_168;
  uint local_138 [4];
  undefined1 local_128 [32];
  undefined1 local_108 [16];
  float local_f8 [4];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  RTCHitN local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar20 = context->scene;
  local_138[0] = Disc->sharedGeomID;
  pGVar8 = (pSVar20->geometries).items[local_138[0]].ptr;
  lVar22 = *(long *)&pGVar8->field_0x58;
  _Var9 = pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar25 = *(undefined1 (*) [16])(lVar22 + (Disc->primIDs).field_0.i[0] * _Var9);
  auVar26 = *(undefined1 (*) [16])(lVar22 + (Disc->primIDs).field_0.i[1] * _Var9);
  auVar28 = *(undefined1 (*) [16])(lVar22 + (Disc->primIDs).field_0.i[2] * _Var9);
  auVar29 = *(undefined1 (*) [16])(lVar22 + (Disc->primIDs).field_0.i[3] * _Var9);
  auVar11 = vunpcklps_avx(auVar25,auVar28);
  auVar32 = vunpckhps_avx(auVar25,auVar28);
  auVar25 = vunpcklps_avx(auVar26,auVar29);
  auVar36 = vunpckhps_avx(auVar26,auVar29);
  auVar26 = vunpcklps_avx(auVar11,auVar25);
  auVar25 = vunpckhps_avx(auVar11,auVar25);
  auVar30 = vunpcklps_avx(auVar32,auVar36);
  bVar7 = Disc->numPrimitives;
  auVar28._1_3_ = 0;
  auVar28[0] = bVar7;
  auVar28[4] = bVar7;
  auVar28._5_3_ = 0;
  auVar28[8] = bVar7;
  auVar28._9_3_ = 0;
  auVar28[0xc] = bVar7;
  auVar28._13_3_ = 0;
  auVar28 = vpcmpgtd_avx(auVar28,_DAT_01ff0cf0);
  local_138[1] = local_138[0];
  local_138[2] = local_138[0];
  local_138[3] = local_138[0];
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar29._4_4_ = uVar1;
  auVar29._0_4_ = uVar1;
  auVar29._8_4_ = uVar1;
  auVar29._12_4_ = uVar1;
  auVar29 = vsubps_avx(auVar26,auVar29);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar11 = vsubps_avx(auVar25,auVar26);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar30 = vsubps_avx(auVar30,auVar25);
  fVar2 = *(float *)(ray + k * 4 + 0x40);
  auVar24._4_4_ = fVar2;
  auVar24._0_4_ = fVar2;
  auVar24._8_4_ = fVar2;
  auVar24._12_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x50);
  auVar27._4_4_ = fVar3;
  auVar27._0_4_ = fVar3;
  auVar27._8_4_ = fVar3;
  auVar27._12_4_ = fVar3;
  fVar4 = *(float *)(ray + k * 4 + 0x60);
  auVar25 = vfmadd231ps_fma(ZEXT416((uint)(fVar4 * fVar4)),auVar27,auVar27);
  auVar25 = vfmadd231ps_fma(auVar25,auVar24,auVar24);
  auVar39._0_4_ = auVar25._0_4_;
  auVar39._4_4_ = auVar39._0_4_;
  auVar39._8_4_ = auVar39._0_4_;
  auVar39._12_4_ = auVar39._0_4_;
  auVar25 = vrcpps_avx(auVar39);
  auVar46._8_4_ = 0x3f800000;
  auVar46._0_8_ = &DAT_3f8000003f800000;
  auVar46._12_4_ = 0x3f800000;
  auVar26 = vfnmadd231ps_fma(auVar46,auVar25,auVar39);
  auVar25 = vfmadd132ps_fma(auVar26,auVar25,auVar25);
  fVar31 = auVar30._0_4_;
  auVar40._0_4_ = fVar31 * fVar4;
  fVar33 = auVar30._4_4_;
  auVar40._4_4_ = fVar33 * fVar4;
  fVar34 = auVar30._8_4_;
  auVar40._8_4_ = fVar34 * fVar4;
  fVar35 = auVar30._12_4_;
  auVar40._12_4_ = fVar35 * fVar4;
  auVar26 = vfmadd231ps_fma(auVar40,auVar11,auVar27);
  auVar26 = vfmadd231ps_fma(auVar26,auVar29,auVar24);
  local_108._0_4_ = auVar26._0_4_ * auVar25._0_4_;
  local_108._4_4_ = auVar26._4_4_ * auVar25._4_4_;
  local_108._8_4_ = auVar26._8_4_ * auVar25._8_4_;
  local_108._12_4_ = auVar26._12_4_ * auVar25._12_4_;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  auVar25 = vcmpps_avx(auVar43,local_108,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar26 = vcmpps_avx(local_108,auVar47,2);
  auVar25 = vandps_avx(auVar26,auVar25);
  auVar26 = auVar28 & auVar25;
  if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar26[0xf] < '\0') {
    auVar25 = vandps_avx(auVar25,auVar28);
    auVar32 = vunpckhps_avx(auVar32,auVar36);
    auVar36._0_4_ = local_108._0_4_ * fVar2;
    auVar36._4_4_ = local_108._4_4_ * fVar2;
    auVar36._8_4_ = local_108._8_4_ * fVar2;
    auVar36._12_4_ = local_108._12_4_ * fVar2;
    auVar44._0_4_ = local_108._0_4_ * fVar3;
    auVar44._4_4_ = local_108._4_4_ * fVar3;
    auVar44._8_4_ = local_108._8_4_ * fVar3;
    auVar44._12_4_ = local_108._12_4_ * fVar3;
    auVar48._0_4_ = local_108._0_4_ * fVar4;
    auVar48._4_4_ = local_108._4_4_ * fVar4;
    auVar48._8_4_ = local_108._8_4_ * fVar4;
    auVar48._12_4_ = local_108._12_4_ * fVar4;
    auVar26 = vsubps_avx(auVar29,auVar36);
    auVar28 = vsubps_avx(auVar11,auVar44);
    auVar30 = vsubps_avx(auVar30,auVar48);
    auVar49._0_4_ = auVar30._0_4_ * auVar30._0_4_;
    auVar49._4_4_ = auVar30._4_4_ * auVar30._4_4_;
    auVar49._8_4_ = auVar30._8_4_ * auVar30._8_4_;
    auVar49._12_4_ = auVar30._12_4_ * auVar30._12_4_;
    auVar28 = vfmadd231ps_fma(auVar49,auVar28,auVar28);
    auVar26 = vfmadd231ps_fma(auVar28,auVar26,auVar26);
    auVar30._0_4_ = auVar32._0_4_ * auVar32._0_4_;
    auVar30._4_4_ = auVar32._4_4_ * auVar32._4_4_;
    auVar30._8_4_ = auVar32._8_4_ * auVar32._8_4_;
    auVar30._12_4_ = auVar32._12_4_ * auVar32._12_4_;
    auVar26 = vcmpps_avx(auVar26,auVar30,2);
    auVar28 = auVar25 & auVar26;
    if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar28[0xf] < '\0')
    {
      auVar26 = vandps_avx(auVar25,auVar26);
      auVar32._0_4_ = fVar31 * fVar31;
      auVar32._4_4_ = fVar33 * fVar33;
      auVar32._8_4_ = fVar34 * fVar34;
      auVar32._12_4_ = fVar35 * fVar35;
      auVar28 = vfmadd213ps_fma(auVar11,auVar11,auVar32);
      auVar28 = vfmadd213ps_fma(auVar29,auVar29,auVar28);
      auVar28 = vcmpps_avx(auVar28,auVar30,6);
      auVar28 = vandps_avx(auVar26,auVar28);
      iVar18 = vmovmskps_avx(auVar28);
      if (iVar18 != 0) {
        local_e8._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
        local_e8._8_4_ = -fVar3;
        local_e8._12_4_ = -fVar3;
        local_d8._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
        local_d8._8_4_ = -fVar4;
        local_d8._12_4_ = -fVar4;
        local_128 = ZEXT1632(ZEXT816(0));
        local_f8[0] = -fVar2;
        local_f8[1] = -fVar2;
        local_f8[2] = -fVar2;
        local_f8[3] = -fVar2;
        uVar21 = (ulong)(byte)iVar18;
        lVar22 = (long)(1 << ((uint)k & 0x1f)) * 0x10;
        auVar37 = vpcmpeqd_avx2(ZEXT1632(auVar26),ZEXT1632(auVar26));
        auVar38 = ZEXT3264(auVar37);
        auVar41 = ZEXT464(0) << 0x20;
        auVar25 = vpcmpeqd_avx(auVar25,auVar25);
        auVar42 = ZEXT1664(auVar25);
        auVar45 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
        local_178 = Disc;
        local_180 = context;
        do {
          local_168.hit = local_c8;
          local_168.valid = (int *)&local_198;
          uVar12 = 0;
          for (uVar19 = uVar21; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            uVar12 = uVar12 + 1;
          }
          local_68 = local_138[uVar12];
          pGVar8 = (pSVar20->geometries).items[local_68].ptr;
          if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            uVar21 = uVar21 ^ 1L << (uVar12 & 0x3f);
            bVar23 = true;
          }
          else if ((local_180->args->filter == (RTCFilterFunctionN)0x0) &&
                  (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            bVar23 = false;
          }
          else {
            uVar19 = (ulong)(uint)((int)uVar12 * 4);
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            uVar5 = *(undefined4 *)(local_128 + uVar19);
            local_98._4_4_ = uVar5;
            local_98._0_4_ = uVar5;
            local_98._8_4_ = uVar5;
            local_98._12_4_ = uVar5;
            uVar5 = *(undefined4 *)(local_128 + uVar19 + 0x10);
            local_88._4_4_ = uVar5;
            local_88._0_4_ = uVar5;
            local_88._8_4_ = uVar5;
            local_88._12_4_ = uVar5;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_108 + uVar19);
            local_168.context = local_180->user;
            uVar5 = *(undefined4 *)((long)&(local_178->primIDs).field_0 + uVar19);
            local_78._4_4_ = uVar5;
            local_78._0_4_ = uVar5;
            local_78._8_4_ = uVar5;
            local_78._12_4_ = uVar5;
            uVar5 = *(undefined4 *)((long)local_f8 + uVar19);
            uVar6 = *(undefined4 *)(local_e8 + uVar19);
            local_b8._4_4_ = uVar6;
            local_b8._0_4_ = uVar6;
            local_b8._8_4_ = uVar6;
            local_b8._12_4_ = uVar6;
            uVar6 = *(undefined4 *)(local_d8 + uVar19);
            local_a8._4_4_ = uVar6;
            local_a8._0_4_ = uVar6;
            local_a8._8_4_ = uVar6;
            local_a8._12_4_ = uVar6;
            local_c8[0] = (RTCHitN)(char)uVar5;
            local_c8[1] = (RTCHitN)(char)((uint)uVar5 >> 8);
            local_c8[2] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
            local_c8[3] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
            local_c8[4] = (RTCHitN)(char)uVar5;
            local_c8[5] = (RTCHitN)(char)((uint)uVar5 >> 8);
            local_c8[6] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
            local_c8[7] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
            local_c8[8] = (RTCHitN)(char)uVar5;
            local_c8[9] = (RTCHitN)(char)((uint)uVar5 >> 8);
            local_c8[10] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
            local_c8[0xb] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
            local_c8[0xc] = (RTCHitN)(char)uVar5;
            local_c8[0xd] = (RTCHitN)(char)((uint)uVar5 >> 8);
            local_c8[0xe] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
            local_c8[0xf] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
            uStack_64 = local_68;
            uStack_60 = local_68;
            uStack_5c = local_68;
            uStack_54 = (local_168.context)->instID[0];
            local_58 = uStack_54;
            uStack_50 = uStack_54;
            uStack_4c = uStack_54;
            uStack_48 = (local_168.context)->instPrimID[0];
            uStack_44 = uStack_48;
            uStack_40 = uStack_48;
            uStack_3c = uStack_48;
            local_198 = *(undefined8 *)(mm_lookupmask_ps + lVar22);
            uStack_190 = *(undefined8 *)(mm_lookupmask_ps + lVar22 + 8);
            local_168.geometryUserPtr = pGVar8->userPtr;
            local_168.N = 4;
            local_168.ray = (RTCRayN *)ray;
            if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar37 = ZEXT1632(auVar38._0_16_);
              auVar25 = auVar42._0_16_;
              local_170 = pSVar20;
              (*pGVar8->occlusionFilterN)(&local_168);
              auVar45 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar25 = vpcmpeqd_avx(auVar25,auVar25);
              auVar42 = ZEXT1664(auVar25);
              auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar37 = vpcmpeqd_avx2(auVar37,auVar37);
              auVar38 = ZEXT3264(auVar37);
              pSVar20 = local_170;
            }
            auVar11._8_8_ = uStack_190;
            auVar11._0_8_ = local_198;
            auVar25 = auVar42._0_16_;
            if (auVar11 == (undefined1  [16])0x0) {
              auVar26 = vpcmpeqd_avx(auVar41._0_16_,(undefined1  [16])0x0);
              auVar25 = auVar25 ^ auVar26;
            }
            else {
              p_Var10 = local_180->args->filter;
              if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                 (((local_180->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                auVar37 = ZEXT1632(auVar38._0_16_);
                (*p_Var10)(&local_168);
                auVar45 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
                auVar25 = vpcmpeqd_avx(auVar25,auVar25);
                auVar42 = ZEXT1664(auVar25);
                auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar37 = vpcmpeqd_avx2(auVar37,auVar37);
                auVar38 = ZEXT3264(auVar37);
              }
              auVar17._8_8_ = uStack_190;
              auVar17._0_8_ = local_198;
              auVar26 = vpcmpeqd_avx(auVar41._0_16_,auVar17);
              auVar25 = auVar42._0_16_ ^ auVar26;
              auVar26 = vblendvps_avx(auVar45._0_16_,*(undefined1 (*) [16])(local_168.ray + 0x80),
                                      auVar26);
              *(undefined1 (*) [16])(local_168.ray + 0x80) = auVar26;
            }
            auVar25 = vpslld_avx(auVar25,0x1f);
            bVar15 = (auVar25 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
            bVar16 = (auVar25 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
            bVar14 = (auVar25 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
            bVar13 = -1 < auVar25[0xf];
            bVar23 = ((bVar15 && bVar16) && bVar14) && bVar13;
            if (((bVar15 && bVar16) && bVar14) && bVar13) {
              *(undefined4 *)(ray + k * 4 + 0x80) = uVar1;
              uVar21 = uVar21 ^ 1L << (uVar12 & 0x3f);
            }
          }
        } while ((uVar21 != 0) && (bVar23 != false));
        return (bool)(bVar23 ^ 1);
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }